

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

int combined_motion_search
              (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int_mv *tmp_mv,int *rate_mv,
              int64_t best_rd_sofar,int use_base_mv)

{
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  MV MVar5;
  int_mv *in_RCX;
  BLOCK_SIZE in_DL;
  MACROBLOCK *in_RSI;
  AV1_COMP *in_RDI;
  int *in_R8;
  long in_R9;
  int in_stack_00000008;
  MV subpel_start_mv;
  _Bool fullpel_performed_well;
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  MV mvp_full;
  uint full_var_rd;
  FULLPEL_MV_STATS best_mv_stats;
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  search_site_config *src_search_sites;
  SEARCH_METHODS search_method;
  int search_subpel;
  int cost_list [5];
  int rv;
  int dis;
  MV center_mv;
  MV ref_mv;
  int ref;
  FULLPEL_MV start_mv;
  int step_param;
  MB_MODE_INFO *mi;
  SPEED_FEATURES *sf;
  AV1_COMMON *cm;
  MACROBLOCKD *xd;
  int *in_stack_000002d0;
  uint *in_stack_000002d8;
  int_mv *in_stack_000002e0;
  undefined8 in_stack_fffffffffffffd78;
  SEARCH_METHODS search_method_00;
  int **ppiVar6;
  MACROBLOCK *in_stack_fffffffffffffd80;
  int *mvjcost;
  uint *mvjcost_00;
  AV1_COMP *in_stack_fffffffffffffd88;
  MV *pMVar7;
  undefined4 in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  undefined5 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9d;
  bool bVar8;
  undefined1 in_stack_fffffffffffffd9e;
  undefined1 in_stack_fffffffffffffd9f;
  undefined4 in_stack_fffffffffffffda0;
  undefined2 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdaa;
  undefined1 in_stack_fffffffffffffdae;
  undefined1 in_stack_fffffffffffffdaf;
  MV *in_stack_fffffffffffffdb0;
  BLOCK_SIZE in_stack_fffffffffffffdbf;
  SUBPEL_FORCE_STOP in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc1;
  AV1_COMP *in_stack_fffffffffffffdc8;
  SUBPEL_MOTION_SEARCH_PARAMS *in_stack_fffffffffffffdd0;
  MV *in_stack_fffffffffffffdf8;
  BLOCK_SIZE in_stack_fffffffffffffe07;
  MACROBLOCK *in_stack_fffffffffffffe08;
  AV1_COMP *in_stack_fffffffffffffe10;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  FULLPEL_MV in_stack_fffffffffffffe24;
  AV1_COMMON *in_stack_fffffffffffffe28;
  MACROBLOCKD *in_stack_fffffffffffffe30;
  SEARCH_METHODS in_stack_fffffffffffffe38;
  MV in_stack_fffffffffffffe3c;
  int in_stack_fffffffffffffe40;
  FULLPEL_MV_STATS local_19c [11];
  FULLPEL_MV_STATS *in_stack_fffffffffffffee8;
  FULLPEL_MV *in_stack_fffffffffffffef0;
  int *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff04;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_ffffffffffffff08;
  FULLPEL_MV in_stack_ffffffffffffff10;
  FULLPEL_MV *in_stack_ffffffffffffff20;
  int local_98 [8];
  uint local_78;
  undefined8 local_74;
  int_mv local_6c;
  int_mv local_68;
  int local_64;
  FULLPEL_MV local_60;
  int local_5c;
  MB_MODE_INFO *local_58;
  SPEED_FEATURES *local_50;
  AV1_COMMON *local_48;
  MACROBLOCKD *local_40;
  long local_38;
  int *local_30;
  int_mv *local_28;
  BLOCK_SIZE local_19;
  MACROBLOCK *local_18;
  AV1_COMP *local_10;
  
  search_method_00 = (SEARCH_METHODS)((ulong)in_stack_fffffffffffffd78 >> 0x38);
  local_40 = &in_RSI->e_mbd;
  local_48 = &in_RDI->common;
  local_50 = &in_RDI->sf;
  local_58 = *(in_RSI->e_mbd).mi;
  if ((in_RDI->sf).rt_sf.fullpel_search_step_param == 0) {
    iVar3 = (in_RDI->mv_search_params).mv_step_param;
  }
  else {
    iVar3 = (in_RDI->sf).rt_sf.fullpel_search_step_param;
  }
  local_64 = (int)local_58->ref_frame[0];
  local_5c = iVar3;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_19 = in_DL;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_6c = av1_get_ref_mv((MACROBLOCK *)
                            CONCAT17(in_stack_fffffffffffffd9f,
                                     CONCAT16(in_stack_fffffffffffffd9e,
                                              CONCAT15(in_stack_fffffffffffffd9d,
                                                       in_stack_fffffffffffffd98))),
                            in_stack_fffffffffffffd94);
  local_78 = 0;
  local_68 = local_6c;
  local_60 = get_fullmv_from_mv(&local_68.as_mv);
  if (in_stack_00000008 == 0) {
    local_74._4_4_ = local_68;
  }
  else {
    local_74._4_4_ = *local_28;
  }
  bVar1 = av1_get_default_mv_search_method
                    ((MACROBLOCK *)CONCAT44(iVar3,in_stack_fffffffffffffda0),
                     (MV_SPEED_FEATURES *)
                     CONCAT17(in_stack_fffffffffffffd9f,
                              CONCAT16(in_stack_fffffffffffffd9e,
                                       CONCAT15(in_stack_fffffffffffffd9d,in_stack_fffffffffffffd98)
                                      )),(BLOCK_SIZE)((uint)in_stack_fffffffffffffd94 >> 0x18));
  av1_get_search_site_config(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,search_method_00);
  mvjcost = (int *)CONCAT44((int)((ulong)in_stack_fffffffffffffd80 >> 0x20),(uint)bVar1);
  pMVar7 = (MV *)((ulong)in_stack_fffffffffffffd88 & 0xffffffff00000000);
  av1_make_default_fullpel_ms_params
            (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8,in_stack_fffffffffffffe24,
             (search_site_config *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
             in_stack_fffffffffffffe40);
  cond_cost_list(local_10,local_98);
  ppiVar6 = (int **)0x0;
  iVar3 = av1_full_pixel_search
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                     in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                     in_stack_ffffffffffffff20);
  get_mv_from_fullmv(&local_28->as_fullmv);
  iVar4 = av1_mv_bit_cost((MV *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),pMVar7
                          ,mvjcost,ppiVar6,0);
  *local_30 = iVar4;
  local_78 = (uint)((local_38 < (long)*local_30 * (long)local_18->rdmult + 0x100 >> 9 ^ 0xffU) & 1);
  if (local_78 != 0) {
    av1_make_default_subpel_ms_params
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
               (MACROBLOCK *)CONCAT71(in_stack_fffffffffffffdc1,in_stack_fffffffffffffdc0),
               in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb0,
               (int *)CONCAT17(in_stack_fffffffffffffdaf,
                               CONCAT16(in_stack_fffffffffffffdae,
                                        CONCAT42(in_stack_fffffffffffffdaa,in_stack_fffffffffffffda8
                                                ))));
    if (((local_19 != BLOCK_64X64) || (bVar1 = true, 0x6a69c < (uint)(iVar3 * 0x28))) &&
       ((local_19 != BLOCK_32X32 || (bVar1 = true, 0xa58b < (uint)(iVar3 << 3))))) {
      bVar1 = local_19 == BLOCK_16X16 && (uint)(iVar3 << 3) < 0x278f;
    }
    if (((local_50->rt_sf).reduce_mv_pel_precision_highmotion != 0) ||
       ((local_50->rt_sf).reduce_mv_pel_precision_lowcomplex != 0)) {
      subpel_select(local_10,local_18,local_19,local_28,local_68.as_mv,local_60,(_Bool)bVar1);
    }
    MVar5 = get_mv_from_fullmv(&local_28->as_fullmv);
    _Var2 = use_aggressive_subpel_search_method
                      (local_18,(_Bool)((local_50->rt_sf).use_adaptive_subpel_search & 1),
                       (_Bool)(bVar1 & 1));
    if (_Var2) {
      mvjcost_00 = local_18->pred_sse + local_64;
      ppiVar6 = (int **)&local_74;
      pMVar7 = (MV *)0x0;
      av1_find_best_sub_pixel_tree_pruned_more
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                 (SUBPEL_MOTION_SEARCH_PARAMS *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 in_stack_fffffffffffffe3c,(FULLPEL_MV_STATS *)in_stack_fffffffffffffe18,
                 (MV *)in_stack_fffffffffffffe10,in_stack_000002d0,in_stack_000002d8,
                 in_stack_000002e0);
    }
    else {
      mvjcost_00 = local_18->pred_sse + local_64;
      ppiVar6 = (int **)&local_74;
      pMVar7 = (MV *)0x0;
      (*(local_10->mv_search_params).find_fractional_mv_step)
                (local_40,local_48,(SUBPEL_MOTION_SEARCH_PARAMS *)&stack0xfffffffffffffdb0,MVar5,
                 local_19c,&local_28->as_mv,(int *)ppiVar6,mvjcost_00,(int_mv *)0x0);
    }
    iVar3 = av1_mv_bit_cost((MV *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                            pMVar7,(int *)mvjcost_00,ppiVar6,0);
    *local_30 = iVar3;
  }
  bVar8 = true;
  if ((local_28->as_mv).col == local_68.as_mv.col) {
    bVar8 = (local_28->as_mv).row != local_68.as_mv.row;
  }
  return (uint)bVar8;
}

Assistant:

static int combined_motion_search(AV1_COMP *cpi, MACROBLOCK *x,
                                  BLOCK_SIZE bsize, int_mv *tmp_mv,
                                  int *rate_mv, int64_t best_rd_sofar,
                                  int use_base_mv) {
  MACROBLOCKD *xd = &x->e_mbd;
  const AV1_COMMON *cm = &cpi->common;
  const SPEED_FEATURES *sf = &cpi->sf;
  MB_MODE_INFO *mi = xd->mi[0];
  int step_param = (sf->rt_sf.fullpel_search_step_param)
                       ? sf->rt_sf.fullpel_search_step_param
                       : cpi->mv_search_params.mv_step_param;
  FULLPEL_MV start_mv;
  const int ref = mi->ref_frame[0];
  const MV ref_mv = av1_get_ref_mv(x, mi->ref_mv_idx).as_mv;
  MV center_mv;
  int dis;
  int rv = 0;
  int cost_list[5];
  int search_subpel = 1;

  start_mv = get_fullmv_from_mv(&ref_mv);

  if (!use_base_mv)
    center_mv = ref_mv;
  else
    center_mv = tmp_mv->as_mv;

  const SEARCH_METHODS search_method =
      av1_get_default_mv_search_method(x, &cpi->sf.mv_sf, bsize);
  const search_site_config *src_search_sites =
      av1_get_search_site_config(cpi, x, search_method);
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  FULLPEL_MV_STATS best_mv_stats;
  av1_make_default_fullpel_ms_params(&full_ms_params, cpi, x, bsize, &center_mv,
                                     start_mv, src_search_sites, search_method,
                                     /*fine_search_interval=*/0);

  const unsigned int full_var_rd = av1_full_pixel_search(
      start_mv, &full_ms_params, step_param, cond_cost_list(cpi, cost_list),
      &tmp_mv->as_fullmv, &best_mv_stats, NULL);

  // calculate the bit cost on motion vector
  MV mvp_full = get_mv_from_fullmv(&tmp_mv->as_fullmv);

  *rate_mv = av1_mv_bit_cost(&mvp_full, &ref_mv, x->mv_costs->nmv_joint_cost,
                             x->mv_costs->mv_cost_stack, MV_COST_WEIGHT);

  // TODO(kyslov) Account for Rate Mode!
  rv = !(RDCOST(x->rdmult, (*rate_mv), 0) > best_rd_sofar);

  if (rv && search_subpel) {
    SUBPEL_MOTION_SEARCH_PARAMS ms_params;
    av1_make_default_subpel_ms_params(&ms_params, cpi, x, bsize, &ref_mv,
                                      cost_list);
    const bool fullpel_performed_well =
        (bsize == BLOCK_64X64 && full_var_rd * 40 < 62267 * 7) ||
        (bsize == BLOCK_32X32 && full_var_rd * 8 < 42380) ||
        (bsize == BLOCK_16X16 && full_var_rd * 8 < 10127);
    if (sf->rt_sf.reduce_mv_pel_precision_highmotion ||
        sf->rt_sf.reduce_mv_pel_precision_lowcomplex)
      ms_params.forced_stop = subpel_select(cpi, x, bsize, tmp_mv, ref_mv,
                                            start_mv, fullpel_performed_well);

    MV subpel_start_mv = get_mv_from_fullmv(&tmp_mv->as_fullmv);
    assert(av1_is_subpelmv_in_range(&ms_params.mv_limits, subpel_start_mv));
    // adaptively downgrade subpel search method based on block properties
    if (use_aggressive_subpel_search_method(
            x, sf->rt_sf.use_adaptive_subpel_search, fullpel_performed_well))
      av1_find_best_sub_pixel_tree_pruned_more(
          xd, cm, &ms_params, subpel_start_mv, &best_mv_stats, &tmp_mv->as_mv,
          &dis, &x->pred_sse[ref], NULL);
    else
      cpi->mv_search_params.find_fractional_mv_step(
          xd, cm, &ms_params, subpel_start_mv, &best_mv_stats, &tmp_mv->as_mv,
          &dis, &x->pred_sse[ref], NULL);
    *rate_mv =
        av1_mv_bit_cost(&tmp_mv->as_mv, &ref_mv, x->mv_costs->nmv_joint_cost,
                        x->mv_costs->mv_cost_stack, MV_COST_WEIGHT);
  }
  // The final MV can not be equal to the reference MV as this will trigger an
  // assert later. This can happen if both NEAREST and NEAR modes were skipped.
  rv = (tmp_mv->as_mv.col != ref_mv.col || tmp_mv->as_mv.row != ref_mv.row);
  return rv;
}